

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

anon_class_24_4_17409c4e * __thiscall
rangeless::fn::impl::
par_transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp:7545:37),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp:7546:37)>
::in_batches_of(anon_class_24_4_17409c4e *__return_storage_ptr__,
               par_transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:7545:37),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:7546:37)>
               *this,size_t batch_size)

{
  size_t batch_size_local;
  par_transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:7545:37),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:7546:37)>
  *this_local;
  
  if (1 < batch_size) {
    __return_storage_ptr__->queue_cap = this->queue_cap;
    __return_storage_ptr__->batch_size = batch_size;
    return __return_storage_ptr__;
  }
  __assert_fail("batch_size >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                ,0x1b73,
                "auto rangeless::fn::impl::par_transform<(lambda at /workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp:7545:37), (lambda at /workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp:7546:37)>::in_batches_of(size_t) && [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp:7545:37), Async = (lambda at /workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp:7546:37)]"
               );
}

Assistant:

auto in_batches_of(size_t batch_size) && // rvalue-specific because will move-from
        {
            assert(batch_size >= 2);

            return [ map_fn = std::move(this->map_fn), 
                      async = std::move(this->async),
                  queue_cap = std::move(this->queue_cap),
                 batch_size
                            ] (auto inputs)
            {
                // TODO: can capture map_fn and async below by-move and make this lambda mutable?

                auto batch_transform = [ map_fn ](auto inputs_batch) // [ inputs ] -> [ outputs ]
                {
                    // NB:: since fn::transform is lazy, we need to force eager-evaluation
                    // within the batch-transform function by converting to vector.
                    return fn::to_vector()(
                            fn::transform(map_fn)(
                                std::move(inputs_batch)));
                };

                // par_batch_transform = fn::transform_in_parallel(...), but it has not been declared yet.
                auto par_batch_transform = 
                    impl::par_transform<decltype(batch_transform), Async>{ async, // by-move here?
                                                                           std::move(batch_transform), 
                                                                           queue_cap };

                return fn::concat()(                      // flatten batches of outputs.
                        std::move(par_batch_transform)(   // par-transform batches of inputs.
                            fn::in_groups_of(batch_size)( // batch the inputs.
                                std::move(inputs))));
            };
        }